

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_std::utf8_converter::convert_abi_cxx11_
          (utf8_converter *this,conversion_type how,char *begin,char *end,int param_5)

{
  ulong uVar1;
  char *in_RCX;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  long in_R8;
  wchar_t *lbegin;
  vector<wchar_t,_std::allocator<wchar_t>_> res;
  size_t len;
  wctype_type *ct;
  wstring tmp;
  wchar_t *in_stack_fffffffffffffe90;
  allocator_type *in_stack_fffffffffffffe98;
  vector<wchar_t,_std::allocator<wchar_t>_> *in_stack_fffffffffffffea0;
  allocator *paVar2;
  string *in_stack_fffffffffffffea8;
  string *charset;
  vector<wchar_t,_std::allocator<wchar_t>_> *in_stack_fffffffffffffeb0;
  _Alloc_hider *end_00;
  char *in_stack_fffffffffffffeb8;
  allocator local_e2;
  allocator local_e1;
  string local_e0 [32];
  string *local_c0;
  allocator<wchar_t> local_b5;
  undefined4 local_b4;
  vector<wchar_t,_std::allocator<wchar_t>_> local_b0;
  long local_98;
  ctype *local_90;
  allocator local_71;
  string local_70 [32];
  wstring local_50 [60];
  int local_14;
  
  if (in_EDX - 1U < 3) {
    local_14 = in_EDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"UTF-8",&local_71);
    conv::to_utf<wchar_t>
              (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8
               ,(method_type)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_90 = std::use_facet<std::ctype<wchar_t>>((locale *)(in_RSI + 0x10));
    local_98 = std::__cxx11::wstring::size();
    local_b4 = 0;
    std::allocator<wchar_t>::allocator();
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8,
               (value_type_conflict *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::allocator<wchar_t>::~allocator(&local_b5);
    local_c0 = (string *)std::vector<wchar_t,_std::allocator<wchar_t>_>::operator[](&local_b0,0);
    std::__cxx11::wstring::c_str();
    std::__cxx11::wstring::c_str();
    std::copy<wchar_t_const*,wchar_t*>
              ((wchar_t *)in_stack_fffffffffffffea0,(wchar_t *)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    if (local_14 == 1) {
      std::__ctype_abstract_base<wchar_t>::toupper
                ((__ctype_abstract_base<wchar_t> *)local_90,(int)local_c0);
    }
    else {
      std::__ctype_abstract_base<wchar_t>::tolower
                ((__ctype_abstract_base<wchar_t> *)local_90,(int)local_c0);
    }
    end_00 = &local_c0->_M_dataplus + local_98 * 4;
    paVar2 = &local_e1;
    charset = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"UTF-8",paVar2);
    conv::from_utf<wchar_t>
              ((wchar_t *)paVar2,(wchar_t *)end_00,charset,
               (method_type)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector(in_stack_fffffffffffffea0);
    std::__cxx11::wstring::~wstring(local_50);
  }
  else {
    uVar1 = in_R8 - (long)in_RCX;
    paVar2 = &local_e2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,in_RCX,uVar1,paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_e2);
  }
  return in_RDI;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case upper_case:
        case lower_case:
        case case_folding:
            {
                std::wstring tmp = conv::to_utf<wchar_t>(begin,end,"UTF-8");
                wctype_type const &ct=std::use_facet<wctype_type>(base_);
                size_t len = tmp.size();
                std::vector<wchar_t> res(len+1,0);
                wchar_t *lbegin = &res[0];
                std::copy(tmp.c_str(),tmp.c_str()+len,lbegin);
                if(how == upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return conv::from_utf<wchar_t>(lbegin,lbegin+len,"UTF-8");
            }
        default:
            return std::string(begin,end-begin);
        }
    }